

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QDomAttrPrivate * __thiscall
QDomElementPrivate::setAttributeNodeNS(QDomElementPrivate *this,QDomAttrPrivate *newAttr)

{
  QDomNamedNodeMapPrivate *this_00;
  QDomNodePrivate *pQVar1;
  
  this_00 = this->m_attr;
  if ((newAttr->super_QDomNodePrivate).prefix.d.ptr == (char16_t *)0x0) {
    pQVar1 = (QDomNodePrivate *)0x0;
  }
  else {
    pQVar1 = QDomNamedNodeMapPrivate::namedItemNS
                       (this_00,&(newAttr->super_QDomNodePrivate).namespaceURI,
                        &(newAttr->super_QDomNodePrivate).name);
  }
  QDomNamedNodeMapPrivate::setNamedItem(this_00,&newAttr->super_QDomNodePrivate);
  return (QDomAttrPrivate *)pQVar1;
}

Assistant:

QDomAttrPrivate* QDomElementPrivate::setAttributeNodeNS(QDomAttrPrivate* newAttr)
{
    QDomNodePrivate* n = nullptr;
    if (!newAttr->prefix.isNull())
        n = m_attr->namedItemNS(newAttr->namespaceURI, newAttr->name);

    // Referencing is done by the maps
    m_attr->setNamedItem(newAttr);

    return static_cast<QDomAttrPrivate *>(n);
}